

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_bool32 ma_is_spatial_channel_position(ma_channel channelPosition)

{
  float *pfVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  long lVar3;
  
  uVar2 = (uint)CONCAT71(in_register_00000039,channelPosition);
  if (((5 < uVar2) || ((0x23U >> (uVar2 & 0x1f) & 1) == 0)) &&
     (0x1f < (byte)(channelPosition - 0x14))) {
    lVar3 = 0;
    while (lVar3 != 6) {
      pfVar1 = g_maChannelPlaneRatios[channelPosition] + lVar3;
      lVar3 = lVar3 + 1;
      if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_is_spatial_channel_position(ma_channel channelPosition)
{
    int i;

    if (channelPosition == MA_CHANNEL_NONE || channelPosition == MA_CHANNEL_MONO || channelPosition == MA_CHANNEL_LFE) {
        return MA_FALSE;
    }

    if (channelPosition >= MA_CHANNEL_AUX_0 && channelPosition <= MA_CHANNEL_AUX_31) {
        return MA_FALSE;
    }

    for (i = 0; i < 6; ++i) {   /* Each side of a cube. */
        if (g_maChannelPlaneRatios[channelPosition][i] != 0) {
            return MA_TRUE;
        }
    }

    return MA_FALSE;
}